

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O1

void CreateBackwardReferencesNH40
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,HasherHandle hasher,int *dist_cache,
               size_t *last_insert_len,Command *commands,size_t *num_commands,size_t *num_literals)

{
  ulong uVar1;
  int *piVar2;
  long lVar3;
  uint16_t *puVar4;
  BrotliDictionary *pBVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  uint32_t uVar11;
  ulong uVar12;
  byte bVar13;
  ushort uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ushort uVar21;
  int iVar22;
  ulong uVar23;
  uint8_t uVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  uint8_t *puVar29;
  long lVar30;
  ulong uVar31;
  long lVar32;
  int *piVar33;
  ulong uVar34;
  long lVar35;
  ulong uVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  bool bVar48;
  ulong local_148;
  int local_13c;
  ulong local_138;
  int *local_120;
  ulong local_110;
  ulong local_100;
  ulong local_e8;
  ulong local_e0;
  ulong local_d0;
  Command *local_b8;
  ulong local_a0;
  
  uVar41 = *last_insert_len;
  uVar1 = position + num_bytes;
  uVar12 = (position - 3) + num_bytes;
  if (num_bytes < 4) {
    uVar12 = position;
  }
  lVar30 = 0x200;
  if (params->quality < 9) {
    lVar30 = 0x40;
  }
  if (uVar1 <= position + 4) {
    local_b8 = commands;
LAB_0010791e:
    *last_insert_len = (uVar41 + uVar1) - position;
    *num_commands = *num_commands + ((long)local_b8 - (long)commands >> 4);
    return;
  }
  uVar36 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  local_a0 = lVar30 + position;
  lVar3 = position - 1;
  local_b8 = commands;
  local_148 = position;
LAB_001066a0:
  local_100 = uVar1 - local_148;
  uVar19 = uVar36;
  if (local_148 < uVar36) {
    uVar19 = local_148;
  }
  uVar20 = (params->dist).max_distance;
  uVar17 = local_148 & ringbuffer_mask;
  piVar2 = (int *)(ringbuffer + uVar17);
  uVar25 = (uint)(*(int *)(ringbuffer + uVar17) * 0x1e35a7bd) >> 0x11;
  uVar47 = (ulong)((uint)local_100 & 7);
  local_138 = 0x7e4;
  uVar40 = 0;
  lVar37 = 0;
  uVar31 = 0;
  local_110 = 0;
  local_d0 = 0x7e4;
  do {
    uVar38 = (ulong)dist_cache[lVar37];
    uVar18 = local_148 - uVar38;
    uVar24 = (uint8_t)uVar25;
    if ((((lVar37 == 0) || (hasher[(uVar18 & 0xffff) + 0x30028] == uVar24)) && (uVar38 <= uVar19))
       && (uVar18 < local_148)) {
      if (7 < local_100) {
        lVar32 = 0;
        uVar27 = 0;
LAB_0010677e:
        if (*(ulong *)(piVar2 + uVar27 * 2) ==
            *(ulong *)(ringbuffer + uVar27 * 8 + (uVar18 & ringbuffer_mask))) goto code_r0x00106790;
        uVar27 = *(ulong *)(ringbuffer + uVar27 * 8 + (uVar18 & ringbuffer_mask)) ^
                 *(ulong *)(piVar2 + uVar27 * 2);
        uVar18 = 0;
        if (uVar27 != 0) {
          for (; (uVar27 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
          }
        }
        uVar27 = (uVar18 >> 3 & 0x1fffffff) - lVar32;
        goto LAB_001067ca;
      }
      piVar33 = piVar2;
      uVar42 = 0;
LAB_0010683c:
      uVar27 = uVar42;
      if (uVar47 != 0) {
        uVar26 = uVar47 | uVar42;
        uVar28 = uVar47;
        do {
          uVar27 = uVar42;
          if (ringbuffer[uVar42 + (uVar18 & ringbuffer_mask)] != (uint8_t)*piVar33) break;
          piVar33 = (int *)((long)piVar33 + 1);
          uVar42 = uVar42 + 1;
          uVar28 = uVar28 - 1;
          uVar27 = uVar26;
        } while (uVar28 != 0);
      }
LAB_001067ca:
      if ((1 < uVar27) && (uVar18 = uVar27 * 0x87 + 0x78f, local_138 < uVar18)) {
        if (lVar37 != 0) {
          uVar18 = uVar18 - ((0x1ca10U >> ((byte)lVar37 & 2) & 4) + 0x27);
        }
        if (local_138 < uVar18) {
          uVar31 = uVar27;
          uVar40 = uVar27;
          local_d0 = uVar18;
          local_138 = uVar18;
          local_110 = uVar38;
        }
      }
    }
    lVar37 = lVar37 + 1;
  } while (lVar37 != 4);
  uVar28 = (ulong)uVar25;
  lVar37 = *(long *)(hasher + 0x80030);
  uVar38 = local_148 - *(uint *)(hasher + uVar28 * 4 + 0x28);
  uVar21 = *(ushort *)(hasher + uVar28 * 2 + 0x20028);
  uVar18 = (ulong)uVar21;
  uVar27 = (ulong)((uint)local_100 & 7);
  uVar42 = 0;
  uVar47 = uVar38;
  do {
    bVar48 = lVar37 == 0;
    lVar37 = lVar37 + -1;
    if (bVar48) break;
    uVar42 = uVar42 + uVar47;
    uVar26 = uVar31;
    uVar23 = local_d0;
    uVar34 = uVar40;
    uVar46 = local_138;
    uVar39 = local_110;
    if (uVar42 <= uVar19) {
      uVar44 = (ulong)*(ushort *)(hasher + uVar18 * 4 + 0x4002a);
      uVar47 = (ulong)*(ushort *)(hasher + uVar18 * 4 + 0x40028);
      uVar18 = uVar44;
      if (uVar40 + uVar17 <= ringbuffer_mask) {
        uVar44 = local_148 - uVar42 & ringbuffer_mask;
        if ((uVar44 + uVar40 <= ringbuffer_mask) &&
           (ringbuffer[uVar40 + uVar17] == ringbuffer[uVar44 + uVar40])) {
          if (7 < local_100) {
            lVar32 = 0;
            uVar26 = 0;
LAB_00106968:
            if (*(ulong *)(piVar2 + uVar26 * 2) == *(ulong *)(ringbuffer + uVar26 * 8 + uVar44))
            goto code_r0x0010697a;
            uVar23 = *(ulong *)(ringbuffer + uVar26 * 8 + uVar44) ^ *(ulong *)(piVar2 + uVar26 * 2);
            uVar26 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
              }
            }
            uVar26 = (uVar26 >> 3 & 0x1fffffff) - lVar32;
            goto LAB_001069c5;
          }
          uVar23 = 0;
          local_120 = piVar2;
LAB_00106a17:
          uVar26 = uVar23;
          if (uVar27 != 0) {
            uVar46 = uVar27 | uVar23;
            uVar34 = uVar27;
            do {
              uVar26 = uVar23;
              if (ringbuffer[uVar23 + uVar44] != (uint8_t)*local_120) break;
              local_120 = (int *)((long)local_120 + 1);
              uVar23 = uVar23 + 1;
              uVar34 = uVar34 - 1;
              uVar26 = uVar46;
            } while (uVar34 != 0);
          }
LAB_001069c5:
          if (3 < uVar26) {
            iVar22 = 0x1f;
            if ((uint)uVar42 != 0) {
              for (; (uint)uVar42 >> iVar22 == 0; iVar22 = iVar22 + -1) {
              }
            }
            uVar23 = (ulong)(iVar22 * -0x1e + 0x780) + uVar26 * 0x87;
            uVar34 = uVar26;
            uVar46 = uVar23;
            uVar39 = uVar42;
            if (local_138 < uVar23) goto LAB_00106932;
          }
          uVar26 = uVar31;
          uVar23 = local_d0;
          uVar34 = uVar40;
          uVar46 = local_138;
          uVar39 = local_110;
        }
      }
    }
LAB_00106932:
    local_110 = uVar39;
    local_138 = uVar46;
    uVar31 = uVar26;
    local_d0 = uVar23;
    uVar40 = uVar34;
  } while (uVar42 <= uVar19);
  uVar14 = *(ushort *)(hasher + 0x80028);
  *(ushort *)(hasher + 0x80028) = uVar14 + 1;
  hasher[(local_148 & 0xffff) + 0x30028] = uVar24;
  if (0xfffe < uVar38) {
    uVar38 = 0xffff;
  }
  *(short *)(hasher + (ulong)uVar14 * 4 + 0x40028) = (short)uVar38;
  *(ushort *)(hasher + (ulong)uVar14 * 4 + 0x4002a) = uVar21;
  *(int *)(hasher + uVar28 * 4 + 0x28) = (int)local_148;
  *(ushort *)(hasher + uVar28 * 2 + 0x20028) = uVar14;
  local_120 = (int *)uVar31;
  if (local_d0 == 0x7e4) {
    if (*(ulong *)(hasher + 0x18) >> 7 <= *(ulong *)(hasher + 0x20)) {
      uVar31 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
      puVar4 = (params->dictionary).hash_table;
      lVar37 = *(long *)(hasher + 0x18);
      local_13c = 0;
      lVar32 = 0;
LAB_00107336:
      uVar21 = puVar4[uVar31];
      lVar37 = lVar37 + 1;
      *(long *)(hasher + 0x18) = lVar37;
      if ((ulong)uVar21 != 0) {
        uVar25 = uVar21 & 0x1f;
        uVar40 = (ulong)uVar25;
        bVar48 = true;
        if (uVar40 <= local_100) {
          pBVar5 = (params->dictionary).words;
          puVar29 = pBVar5->data + (ulong)pBVar5->offsets_by_length[uVar40] + uVar40 * (uVar21 >> 5)
          ;
          if (7 < uVar40) {
            uVar47 = (ulong)(uVar21 & 0x18);
            lVar43 = 0;
            uVar17 = 0;
LAB_0010739e:
            if (*(ulong *)(puVar29 + uVar17 * 8) == *(ulong *)(piVar2 + uVar17 * 2))
            goto code_r0x001073b1;
            uVar47 = *(ulong *)(piVar2 + uVar17 * 2) ^ *(ulong *)(puVar29 + uVar17 * 8);
            uVar17 = 0;
            if (uVar47 != 0) {
              for (; (uVar47 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
              }
            }
            uVar17 = (uVar17 >> 3 & 0x1fffffff) - lVar43;
            goto LAB_001073e9;
          }
          uVar47 = 0;
          goto LAB_001074ac;
        }
        goto LAB_00107439;
      }
      goto LAB_00107447;
    }
    local_13c = 0;
  }
  else {
    local_13c = 0;
  }
LAB_00106b1b:
  if (0x7e4 < local_d0) {
    lVar37 = *(long *)(hasher + 0x80030);
    uVar19 = (lVar3 + num_bytes) - local_148;
    uVar21 = *(ushort *)(hasher + 0x80028);
    iVar22 = 0;
LAB_00106b61:
    uVar20 = local_148;
    local_100 = local_100 - 1;
    uVar31 = (long)local_120 - 1U;
    if (local_100 <= (long)local_120 - 1U) {
      uVar31 = local_100;
    }
    if (4 < params->quality) {
      uVar31 = 0;
    }
    uVar17 = local_148 + 1;
    uVar40 = uVar36;
    if (uVar17 < uVar36) {
      uVar40 = uVar17;
    }
    uVar47 = (params->dist).max_distance;
    uVar27 = uVar17 & ringbuffer_mask;
    piVar2 = (int *)(ringbuffer + uVar27);
    uVar25 = (uint)(*(int *)(ringbuffer + uVar27) * 0x1e35a7bd) >> 0x11;
    uVar42 = (ulong)((uint)local_100 & 7);
    local_e0 = 0x7e4;
    lVar32 = 0;
    uVar18 = 0;
    local_e8 = 0;
    uVar38 = 0x7e4;
LAB_00106c06:
    uVar28 = (ulong)dist_cache[lVar32];
    uVar26 = uVar17 - uVar28;
    uVar24 = (uint8_t)uVar25;
    if (((lVar32 == 0) || (hasher[(uVar26 & 0xffff) + 0x30028] == uVar24)) &&
       ((uVar28 <= uVar40 && (uVar26 < uVar17)))) {
      uVar23 = uVar42;
      if (7 < local_100) {
        lVar43 = 0;
        uVar34 = 0;
LAB_00106c58:
        if (*(ulong *)(piVar2 + uVar34 * 2) ==
            *(ulong *)(ringbuffer + uVar34 * 8 + (uVar26 & ringbuffer_mask))) goto code_r0x00106c6a;
        uVar23 = *(ulong *)(ringbuffer + uVar34 * 8 + (uVar26 & ringbuffer_mask)) ^
                 *(ulong *)(piVar2 + uVar34 * 2);
        uVar26 = 0;
        if (uVar23 != 0) {
          for (; (uVar23 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
          }
        }
        uVar34 = (uVar26 >> 3 & 0x1fffffff) - lVar43;
        goto LAB_00106c99;
      }
      uVar34 = 0;
      piVar33 = piVar2;
      goto joined_r0x00106d14;
    }
    goto LAB_00106cfa;
  }
  uVar41 = uVar41 + 1;
  position = local_148 + 1;
  if (local_a0 < position) {
    if (position <= (uint)((int)lVar30 * 4) + local_a0) {
      uVar19 = local_148 + 9;
      if (uVar1 - 3 <= local_148 + 9) {
        uVar19 = uVar1 - 3;
      }
      if (position < uVar19) {
        uVar21 = *(ushort *)(hasher + 0x80028);
        do {
          uVar25 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
          uVar20 = (ulong)uVar25;
          uVar31 = position - *(uint *)(hasher + uVar20 * 4 + 0x28);
          hasher[(position & 0xffff) + 0x30028] = (uint8_t)uVar25;
          if (0xfffe < uVar31) {
            uVar31 = 0xffff;
          }
          uVar14 = uVar21 + 1;
          *(short *)(hasher + (ulong)uVar21 * 4 + 0x40028) = (short)uVar31;
          *(undefined2 *)(hasher + (ulong)uVar21 * 4 + 0x4002a) =
               *(undefined2 *)(hasher + uVar20 * 2 + 0x20028);
          *(int *)(hasher + uVar20 * 4 + 0x28) = (int)position;
          *(ushort *)(hasher + uVar20 * 2 + 0x20028) = uVar21;
          uVar41 = uVar41 + 2;
          position = position + 2;
          uVar21 = uVar14;
        } while (position < uVar19);
        goto LAB_001078c6;
      }
      goto LAB_001078d3;
    }
    uVar19 = local_148 + 0x11;
    if (uVar1 - 4 <= local_148 + 0x11) {
      uVar19 = uVar1 - 4;
    }
    if (uVar19 <= position) goto LAB_001078d3;
    uVar21 = *(ushort *)(hasher + 0x80028);
    do {
      uVar25 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
      uVar20 = (ulong)uVar25;
      uVar31 = position - *(uint *)(hasher + uVar20 * 4 + 0x28);
      hasher[(position & 0xffff) + 0x30028] = (uint8_t)uVar25;
      if (0xfffe < uVar31) {
        uVar31 = 0xffff;
      }
      uVar14 = uVar21 + 1;
      *(short *)(hasher + (ulong)uVar21 * 4 + 0x40028) = (short)uVar31;
      *(undefined2 *)(hasher + (ulong)uVar21 * 4 + 0x4002a) =
           *(undefined2 *)(hasher + uVar20 * 2 + 0x20028);
      *(int *)(hasher + uVar20 * 4 + 0x28) = (int)position;
      *(ushort *)(hasher + uVar20 * 2 + 0x20028) = uVar21;
      uVar41 = uVar41 + 4;
      position = position + 4;
      uVar21 = uVar14;
    } while (position < uVar19);
    goto LAB_001078c6;
  }
  goto LAB_001078d3;
code_r0x00106790:
  uVar27 = uVar27 + 1;
  lVar32 = lVar32 + -8;
  piVar33 = (int *)((long)piVar2 + (local_100 & 0xfffffffffffffff8));
  uVar42 = local_100 & 0xfffffffffffffff8;
  if (local_100 >> 3 == uVar27) goto LAB_0010683c;
  goto LAB_0010677e;
code_r0x0010697a:
  uVar26 = uVar26 + 1;
  lVar32 = lVar32 + -8;
  uVar23 = local_100 & 0xfffffffffffffff8;
  local_120 = (int *)(ringbuffer + (local_100 & 0xfffffffffffffff8) + uVar17);
  if (local_100 >> 3 == uVar26) goto LAB_00106a17;
  goto LAB_00106968;
code_r0x001073b1:
  uVar17 = uVar17 + 1;
  lVar43 = lVar43 + -8;
  if (uVar25 >> 3 == uVar17) goto code_r0x001073bd;
  goto LAB_0010739e;
code_r0x001073bd:
  puVar29 = puVar29 + -lVar43;
LAB_001074ac:
  uVar18 = (ulong)uVar21 & 7;
  uVar17 = uVar47;
  if ((uVar21 & 7) != 0) {
    uVar38 = uVar47 | uVar18;
    do {
      uVar17 = uVar47;
      if (*(uint8_t *)((long)piVar2 + uVar47) != *puVar29) break;
      puVar29 = puVar29 + 1;
      uVar47 = uVar47 + 1;
      uVar18 = uVar18 - 1;
      uVar17 = uVar38;
    } while (uVar18 != 0);
  }
LAB_001073e9:
  bVar48 = true;
  if (((uVar17 != 0) && (uVar40 < (params->dictionary).cutoffTransformsCount + uVar17)) &&
     (uVar40 = (ulong)(uVar21 >> 5) + uVar19 + 1 +
               ((ulong)((uint)((params->dictionary).cutoffTransforms >>
                              ((char)(uVar40 - uVar17) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar40 - uVar17) * 4 << (pBVar5->size_bits_by_length[uVar40] & 0x3f)),
     uVar40 <= uVar20)) {
    iVar22 = 0x1f;
    if ((uint)uVar40 != 0) {
      for (; (uint)uVar40 >> iVar22 == 0; iVar22 = iVar22 + -1) {
      }
    }
    uVar47 = (uVar17 * 0x87 - (ulong)(uint)(iVar22 * 0x1e)) + 0x780;
    if (local_d0 <= uVar47) {
      local_13c = uVar25 - (int)uVar17;
      bVar48 = false;
      local_120 = (int *)uVar17;
      local_110 = uVar40;
      local_d0 = uVar47;
    }
  }
LAB_00107439:
  if (!bVar48) {
    *(long *)(hasher + 0x20) = *(long *)(hasher + 0x20) + 1;
  }
LAB_00107447:
  uVar31 = uVar31 + 1;
  bVar48 = lVar32 != 0;
  lVar32 = lVar32 + 1;
  if (bVar48) goto LAB_00106b1b;
  goto LAB_00107336;
code_r0x00106c6a:
  uVar34 = uVar34 + 1;
  lVar43 = lVar43 + -8;
  if (uVar19 >> 3 == uVar34) goto code_r0x00106c78;
  goto LAB_00106c58;
code_r0x00106c78:
  uVar34 = -lVar43;
  piVar33 = (int *)((long)piVar2 - lVar43);
joined_r0x00106d14:
  for (; (uVar23 != 0 && (ringbuffer[uVar34 + (uVar26 & ringbuffer_mask)] == (uint8_t)*piVar33));
      uVar34 = uVar34 + 1) {
    uVar23 = uVar23 - 1;
    piVar33 = (int *)((long)piVar33 + 1);
  }
LAB_00106c99:
  if ((1 < uVar34) && (uVar26 = uVar34 * 0x87 + 0x78f, local_e0 < uVar26)) {
    if (lVar32 != 0) {
      uVar26 = uVar26 - ((0x1ca10U >> ((byte)lVar32 & 2) & 4) + 0x27);
    }
    if (local_e0 < uVar26) {
      uVar18 = uVar34;
      uVar31 = uVar34;
      uVar38 = uVar26;
      local_e8 = uVar28;
      local_e0 = uVar26;
    }
  }
LAB_00106cfa:
  lVar32 = lVar32 + 1;
  if (lVar32 == 4) goto LAB_00106d36;
  goto LAB_00106c06;
LAB_00106d36:
  uVar23 = (ulong)uVar25;
  uVar46 = uVar17 - *(uint *)(hasher + uVar23 * 4 + 0x28);
  uVar14 = *(ushort *)(hasher + uVar23 * 2 + 0x20028);
  uVar28 = (ulong)uVar14;
  uVar26 = (ulong)((uint)local_100 & 7);
  uVar34 = 0;
  lVar32 = lVar37;
  uVar42 = uVar46;
LAB_00106d74:
  bVar48 = lVar32 != 0;
  lVar32 = lVar32 + -1;
  if (bVar48) {
    uVar34 = uVar34 + uVar42;
    uVar39 = uVar31;
    uVar44 = uVar18;
    uVar45 = uVar38;
    uVar8 = local_e8;
    uVar9 = local_e0;
    if (uVar34 <= uVar40) {
      lVar43 = uVar28 * 4;
      uVar42 = (ulong)*(ushort *)(hasher + uVar28 * 4 + 0x40028);
      uVar28 = (ulong)*(ushort *)(hasher + lVar43 + 0x4002a);
      if (uVar31 + uVar27 <= ringbuffer_mask) {
        uVar44 = uVar17 - uVar34 & ringbuffer_mask;
        if ((ringbuffer_mask < uVar44 + uVar31) ||
           (ringbuffer[uVar31 + uVar27] != ringbuffer[uVar44 + uVar31])) goto LAB_00106e7b;
        uVar45 = uVar26;
        if (7 < local_100) {
          lVar35 = 0;
          uVar39 = 0;
LAB_00106dfe:
          if (*(ulong *)(piVar2 + uVar39 * 2) == *(ulong *)(ringbuffer + uVar39 * 8 + uVar44))
          goto code_r0x00106e10;
          uVar44 = *(ulong *)(ringbuffer + uVar39 * 8 + uVar44) ^ *(ulong *)(piVar2 + uVar39 * 2);
          uVar39 = 0;
          if (uVar44 != 0) {
            for (; (uVar44 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
            }
          }
          uVar39 = (uVar39 >> 3 & 0x1fffffff) - lVar35;
          goto LAB_00106e46;
        }
        uVar39 = 0;
        piVar33 = piVar2;
        goto joined_r0x00106ea7;
      }
      goto LAB_00106e7b;
    }
    goto LAB_00106e81;
  }
  goto LAB_00106ed4;
code_r0x00106e10:
  uVar39 = uVar39 + 1;
  lVar35 = lVar35 + -8;
  if (uVar19 >> 3 == uVar39) goto code_r0x00106e1e;
  goto LAB_00106dfe;
code_r0x00106e1e:
  uVar39 = -lVar35;
  piVar33 = (int *)((long)piVar2 - lVar35);
joined_r0x00106ea7:
  for (; (uVar45 != 0 && (ringbuffer[uVar39 + uVar44] == (uint8_t)*piVar33)); uVar39 = uVar39 + 1) {
    uVar45 = uVar45 - 1;
    piVar33 = (int *)((long)piVar33 + 1);
  }
LAB_00106e46:
  if (3 < uVar39) {
    iVar10 = 0x1f;
    if ((uint)uVar34 != 0) {
      for (; (uint)uVar34 >> iVar10 == 0; iVar10 = iVar10 + -1) {
      }
    }
    uVar45 = (ulong)(iVar10 * -0x1e + 0x780) + uVar39 * 0x87;
    uVar44 = uVar39;
    uVar8 = uVar34;
    uVar9 = uVar45;
    if (local_e0 < uVar45) goto LAB_00106e81;
  }
LAB_00106e7b:
  uVar39 = uVar31;
  uVar44 = uVar18;
  uVar45 = uVar38;
  uVar8 = local_e8;
  uVar9 = local_e0;
LAB_00106e81:
  local_e0 = uVar9;
  local_e8 = uVar8;
  uVar38 = uVar45;
  uVar18 = uVar44;
  uVar31 = uVar39;
  if (uVar40 < uVar34) goto LAB_00106ed4;
  goto LAB_00106d74;
LAB_00106ed4:
  *(ushort *)(hasher + 0x80028) = uVar21 + 1;
  if (0xfffe < uVar46) {
    uVar46 = 0xffff;
  }
  hasher[(uVar17 & 0xffff) + 0x30028] = uVar24;
  *(short *)(hasher + (ulong)uVar21 * 4 + 0x40028) = (short)uVar46;
  *(ushort *)(hasher + (ulong)uVar21 * 4 + 0x4002a) = uVar14;
  *(int *)(hasher + uVar23 * 4 + 0x28) = (int)uVar17;
  *(ushort *)(hasher + uVar23 * 2 + 0x20028) = uVar21;
  if (uVar38 == 0x7e4) {
    if (*(ulong *)(hasher + 0x18) >> 7 <= *(ulong *)(hasher + 0x20)) {
      uVar31 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
      puVar4 = (params->dictionary).hash_table;
      lVar32 = *(long *)(hasher + 0x18);
      iVar10 = 0;
      lVar43 = 0;
LAB_00106ff6:
      uVar14 = puVar4[uVar31];
      lVar32 = lVar32 + 1;
      *(long *)(hasher + 0x18) = lVar32;
      if ((ulong)uVar14 != 0) {
        uVar25 = uVar14 & 0x1f;
        uVar27 = (ulong)uVar25;
        bVar48 = true;
        if (uVar27 <= local_100) {
          pBVar5 = (params->dictionary).words;
          puVar29 = pBVar5->data + (ulong)pBVar5->offsets_by_length[uVar27] + uVar27 * (uVar14 >> 5)
          ;
          if (7 < uVar27) {
            uVar28 = (ulong)(uVar14 & 0x18);
            lVar35 = 0;
            uVar42 = 0;
LAB_00107079:
            if (*(ulong *)(puVar29 + uVar42 * 8) == *(ulong *)(piVar2 + uVar42 * 2))
            goto code_r0x0010708c;
            uVar28 = *(ulong *)(piVar2 + uVar42 * 2) ^ *(ulong *)(puVar29 + uVar42 * 8);
            uVar42 = 0;
            if (uVar28 != 0) {
              for (; (uVar28 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
              }
            }
            uVar42 = (uVar42 >> 3 & 0x1fffffff) - lVar35;
            goto LAB_001070ca;
          }
          uVar28 = 0;
          goto LAB_0010715f;
        }
        goto LAB_00107016;
      }
      goto LAB_00107024;
    }
    iVar10 = 0;
  }
  else {
    iVar10 = 0;
  }
LAB_00106f67:
  bVar48 = local_d0 + 0xaf <= uVar38;
  iVar7 = iVar22;
  if (bVar48) {
    uVar41 = uVar41 + 1;
    local_110 = local_e8;
    local_148 = uVar17;
    local_13c = iVar10;
    local_120 = (int *)uVar18;
    local_d0 = uVar38;
    iVar7 = iVar22 + 1;
  }
  bVar6 = 2 < iVar22;
  uVar19 = uVar19 - 1;
  uVar21 = uVar21 + 1;
  iVar22 = iVar7;
  if (!bVar48 || (bVar6 || uVar1 <= uVar20 + 5)) goto code_r0x001071dd;
  goto LAB_00106b61;
code_r0x0010708c:
  uVar42 = uVar42 + 1;
  lVar35 = lVar35 + -8;
  if (uVar25 >> 3 == uVar42) goto code_r0x00107098;
  goto LAB_00107079;
code_r0x00107098:
  puVar29 = puVar29 + -lVar35;
LAB_0010715f:
  uVar26 = (ulong)uVar14 & 7;
  uVar42 = uVar28;
  if ((uVar14 & 7) != 0) {
    uVar23 = uVar28 | uVar26;
    do {
      uVar42 = uVar28;
      if (*(uint8_t *)((long)piVar2 + uVar28) != *puVar29) break;
      puVar29 = puVar29 + 1;
      uVar28 = uVar28 + 1;
      uVar26 = uVar26 - 1;
      uVar42 = uVar23;
    } while (uVar26 != 0);
  }
LAB_001070ca:
  bVar48 = true;
  if (((uVar42 != 0) && (uVar27 < (params->dictionary).cutoffTransformsCount + uVar42)) &&
     (uVar27 = (ulong)(uVar14 >> 5) + uVar40 + 1 +
               ((ulong)((uint)((params->dictionary).cutoffTransforms >>
                              ((char)(uVar27 - uVar42) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar27 - uVar42) * 4 << (pBVar5->size_bits_by_length[uVar27] & 0x3f)),
     uVar27 <= uVar47)) {
    iVar7 = 0x1f;
    if ((uint)uVar27 != 0) {
      for (; (uint)uVar27 >> iVar7 == 0; iVar7 = iVar7 + -1) {
      }
    }
    uVar28 = (uVar42 * 0x87 - (ulong)(uint)(iVar7 * 0x1e)) + 0x780;
    if (uVar38 <= uVar28) {
      iVar10 = uVar25 - (int)uVar42;
      bVar48 = false;
      uVar18 = uVar42;
      uVar38 = uVar28;
      local_e8 = uVar27;
    }
  }
LAB_00107016:
  if (!bVar48) {
    *(long *)(hasher + 0x20) = *(long *)(hasher + 0x20) + 1;
  }
LAB_00107024:
  uVar31 = uVar31 + 1;
  bVar48 = lVar43 != 0;
  lVar43 = lVar43 + 1;
  if (bVar48) goto LAB_00106f67;
  goto LAB_00106ff6;
code_r0x001071dd:
  uVar19 = uVar36;
  if (local_148 < uVar36) {
    uVar19 = local_148;
  }
  if (local_110 <= uVar19) {
    uVar25 = 0;
    bVar48 = false;
    if (local_110 != (long)*dist_cache) {
      if (local_110 == (long)dist_cache[1]) {
        uVar25 = 1;
      }
      else {
        uVar20 = (local_110 + 3) - (long)*dist_cache;
        if (uVar20 < 7) {
          bVar13 = (byte)((int)uVar20 << 2);
          uVar25 = 0x9750468;
        }
        else {
          uVar20 = (local_110 + 3) - (long)dist_cache[1];
          if (6 < uVar20) {
            if (local_110 != (long)dist_cache[2]) {
              bVar48 = local_110 != (long)dist_cache[3];
              uVar25 = 3;
              goto LAB_001075c1;
            }
            uVar25 = 2;
            goto LAB_001075bf;
          }
          bVar13 = (byte)((int)uVar20 << 2);
          uVar25 = 0xfdb1ace;
        }
        uVar25 = uVar25 >> (bVar13 & 0x1f) & 0xf;
      }
LAB_001075bf:
      bVar48 = false;
    }
LAB_001075c1:
    if (!bVar48) {
      uVar20 = (ulong)uVar25;
      goto LAB_001075d2;
    }
  }
  uVar20 = local_110 + 0xf;
LAB_001075d2:
  if ((local_110 <= uVar19) && (uVar20 != 0)) {
    dist_cache[3] = dist_cache[2];
    *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
    *dist_cache = (int)local_110;
  }
  uVar25 = (uint)uVar41;
  local_b8->insert_len_ = uVar25;
  local_b8->copy_len_ = local_13c << 0x19 | (uint)local_120;
  uVar31 = (ulong)(params->dist).num_direct_distance_codes;
  uVar19 = uVar31 + 0x10;
  if (uVar20 < uVar19) {
    local_b8->dist_prefix_ = (uint16_t)uVar20;
    uVar11 = 0;
  }
  else {
    uVar11 = (params->dist).distance_postfix_bits;
    bVar13 = (byte)uVar11;
    uVar20 = ((uVar20 - uVar31) + (4L << (bVar13 & 0x3f))) - 0x10;
    uVar15 = 0x1f;
    if ((uint)uVar20 != 0) {
      for (; (uint)uVar20 >> uVar15 == 0; uVar15 = uVar15 - 1) {
      }
    }
    uVar15 = (uVar15 ^ 0xffffffe0) + 0x1f;
    bVar48 = (uVar20 >> ((ulong)uVar15 & 0x3f) & 1) != 0;
    iVar22 = uVar15 - uVar11;
    local_b8->dist_prefix_ =
         (short)((uint)bVar48 + iVar22 * 2 + 0xfffe << (bVar13 & 0x3f)) +
         (short)uVar19 + (~(ushort)(-1 << (bVar13 & 0x1f)) & (ushort)uVar20) | (short)iVar22 * 0x400
    ;
    uVar11 = (uint32_t)(uVar20 - ((ulong)bVar48 + 2 << ((byte)uVar15 & 0x3f)) >> (bVar13 & 0x3f));
  }
  local_b8->dist_extra_ = uVar11;
  if (5 < uVar41) {
    if (uVar41 < 0x82) {
      uVar25 = 0x1f;
      uVar15 = (uint)(uVar41 - 2);
      if (uVar15 != 0) {
        for (; uVar15 >> uVar25 == 0; uVar25 = uVar25 - 1) {
        }
      }
      uVar25 = (int)(uVar41 - 2 >> ((char)(uVar25 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar25 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (uVar41 < 0x842) {
      uVar15 = 0x1f;
      if (uVar25 - 0x42 != 0) {
        for (; uVar25 - 0x42 >> uVar15 == 0; uVar15 = uVar15 - 1) {
        }
      }
      uVar25 = (uVar15 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar25 = 0x15;
      if (0x1841 < uVar41) {
        uVar25 = (uint)(ushort)(0x17 - (uVar41 < 0x5842));
      }
    }
  }
  uVar15 = local_13c + (uint)local_120;
  if (uVar15 < 10) {
    uVar16 = uVar15 - 2;
  }
  else if (uVar15 < 0x86) {
    uVar15 = uVar15 - 6;
    uVar16 = 0x1f;
    if (uVar15 != 0) {
      for (; uVar15 >> uVar16 == 0; uVar16 = uVar16 - 1) {
      }
    }
    uVar16 = (int)((ulong)(long)(int)uVar15 >> ((char)(uVar16 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
             (uVar16 ^ 0xffffffe0) * 2 + 0x42;
  }
  else {
    uVar16 = 0x17;
    if (uVar15 < 0x846) {
      uVar16 = 0x1f;
      if (uVar15 - 0x46 != 0) {
        for (; uVar15 - 0x46 >> uVar16 == 0; uVar16 = uVar16 - 1) {
        }
      }
      uVar16 = (uVar16 ^ 0xffe0) + 0x2c;
    }
  }
  uVar14 = (ushort)uVar16;
  uVar21 = (uVar14 & 7) + ((ushort)uVar25 & 7) * 8;
  if ((((local_b8->dist_prefix_ & 0x3ff) == 0) && ((ushort)uVar25 < 8)) && (uVar14 < 0x10)) {
    if (7 < uVar14) {
      uVar21 = uVar21 | 0x40;
    }
  }
  else {
    iVar22 = ((uVar25 & 0xffff) >> 3) * 3 + ((uVar16 & 0xffff) >> 3);
    uVar21 = uVar21 + ((ushort)(0x520d40 >> ((char)iVar22 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar22 * 0x40 + 0x40;
  }
  local_b8->cmd_prefix_ = uVar21;
  *num_literals = *num_literals + uVar41;
  position = local_148 + (long)local_120;
  uVar41 = uVar12;
  if (position < uVar12) {
    uVar41 = position;
  }
  uVar19 = local_148 + 2;
  if (local_110 < (ulong)local_120 >> 2) {
    uVar20 = position + local_110 * -4;
    if (uVar20 < uVar19) {
      uVar20 = uVar19;
    }
    uVar19 = uVar20;
    if (uVar41 < uVar20) {
      uVar19 = uVar41;
    }
  }
  local_a0 = lVar30 + (long)local_120 * 2 + local_148;
  local_b8 = local_b8 + 1;
  if (uVar19 < uVar41) {
    uVar21 = *(ushort *)(hasher + 0x80028);
    do {
      uVar25 = (uint)(*(int *)(ringbuffer + (uVar19 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
      uVar20 = (ulong)uVar25;
      uVar31 = uVar19 - *(uint *)(hasher + uVar20 * 4 + 0x28);
      hasher[(uVar19 & 0xffff) + 0x30028] = (uint8_t)uVar25;
      if (0xfffe < uVar31) {
        uVar31 = 0xffff;
      }
      uVar14 = uVar21 + 1;
      *(short *)(hasher + (ulong)uVar21 * 4 + 0x40028) = (short)uVar31;
      *(undefined2 *)(hasher + (ulong)uVar21 * 4 + 0x4002a) =
           *(undefined2 *)(hasher + uVar20 * 2 + 0x20028);
      *(int *)(hasher + uVar20 * 4 + 0x28) = (int)uVar19;
      *(ushort *)(hasher + uVar20 * 2 + 0x20028) = uVar21;
      uVar19 = uVar19 + 1;
      uVar21 = uVar14;
    } while (uVar41 != uVar19);
    uVar41 = 0;
LAB_001078c6:
    *(ushort *)(hasher + 0x80028) = uVar14;
  }
  else {
    uVar41 = 0;
  }
LAB_001078d3:
  local_148 = position;
  if (uVar1 <= position + 4) goto LAB_0010791e;
  goto LAB_001066a0;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, HasherHandle hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(hasher, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(hasher, &params->dictionary,
                         ringbuffer, ringbuffer_mask, dist_cache, position,
                         max_length, max_distance, gap,
                         params->dist.max_distance, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        FN(FindLongestMatch)(hasher, &params->dictionary,
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, gap, params->dist.max_distance, &sr2);
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code =
            ComputeDistanceCode(sr.distance, max_distance + gap, dist_cache);
        if ((sr.distance <= (max_distance + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(hasher, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(hasher, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}